

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_heap.cpp
# Opt level: O1

string_t __thiscall duckdb::StringHeap::EmptyString(StringHeap *this,idx_t len)

{
  anon_union_16_2_67f50693_for_value aVar1;
  data_ptr_t __src;
  OutOfRangeException *this_00;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  if (len >> 0x20 == 0) {
    __src = ArenaAllocator::Allocate(&this->allocator,len);
    if (len < 0xd) {
      uStack_44 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      if (len != 0) {
        switchD_012dd528::default(&uStack_4c,__src,len);
      }
    }
    else {
      uStack_4c = *(undefined4 *)__src;
      uStack_48 = SUB84(__src,0);
      uStack_44 = (undefined4)((ulong)__src >> 0x20);
    }
    aVar1._4_1_ = (undefined1)uStack_4c;
    aVar1._5_1_ = uStack_4c._1_1_;
    aVar1._6_1_ = uStack_4c._2_1_;
    aVar1._7_1_ = uStack_4c._3_1_;
    aVar1.pointer.length = (int)len;
    aVar1._8_4_ = uStack_48;
    aVar1._12_4_ = uStack_44;
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Cannot create a string of size: \'%d\', the maximum supported string size is: \'%d\'",
             "");
  OutOfRangeException::OutOfRangeException<unsigned_long,unsigned_long>
            (this_00,&local_40,len,0xffffffff);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string_t StringHeap::EmptyString(idx_t len) {
	D_ASSERT(len > string_t::INLINE_LENGTH);
	if (len > string_t::MAX_STRING_SIZE) {
		throw OutOfRangeException("Cannot create a string of size: '%d', the maximum supported string size is: '%d'",
		                          len, string_t::MAX_STRING_SIZE);
	}
	auto insert_pos = const_char_ptr_cast(allocator.Allocate(len));
	return string_t(insert_pos, UnsafeNumericCast<uint32_t>(len));
}